

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O3

int __thiscall
wasm::
TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
::Selector::select(Selector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
                  fd_set *__exceptfds,timeval *__timeout)

{
  uint uVar1;
  pointer puVar2;
  GlobalTypeRewriter *pGVar3;
  pointer ppVar4;
  pointer pvVar5;
  uint *puVar6;
  iterator iVar7;
  iterator iVar8;
  pointer puVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  pointer puVar14;
  uint *puVar15;
  undefined4 in_register_00000034;
  TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
  *this_00;
  long lVar16;
  long lVar17;
  bool bVar18;
  key_type local_68;
  HeapType typeA;
  
  this_00 = (TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
             *)CONCAT44(in_register_00000034,__nfds);
  if (this->count == 0) {
    __assert_fail("count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xde,
                  "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
                 );
  }
  uVar10 = this->start;
  puVar9 = (this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2) <
      (ulong)(this->count + uVar10)) {
    __assert_fail("start + count <= ctx.buf.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xdf,
                  "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
                 );
  }
  puVar2 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar14 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (4 < (long)puVar14 - (long)puVar2) {
    uVar10 = puVar14[-1];
    puVar14[-1] = *puVar2;
    uVar12 = (long)puVar14 + (-4 - (long)puVar2);
    lVar13 = (long)uVar12 >> 2;
    if (lVar13 < 3) {
      lVar17 = 0;
    }
    else {
      lVar16 = 0;
      do {
        pGVar3 = (this_00->cmp).this;
        ppVar4 = (((this_00->cmp).privateSupertypes)->
                 super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar1 = puVar2[lVar16 * 2 + 1];
        uVar11 = puVar2[lVar16 * 2 + 2];
        local_68.id = ppVar4[uVar1].first.id;
        typeA.id = ppVar4[uVar11].first.id;
        iVar7 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pGVar3->wasm->typeIndices)._M_h,&local_68);
        iVar8 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pGVar3->wasm->typeIndices)._M_h,&typeA);
        if ((iVar7.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
             _M_cur != (__node_type *)0x0) ==
            (iVar8.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
             _M_cur != (__node_type *)0x0)) {
          if (iVar7.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
              _M_cur != (__node_type *)0x0) {
            if ((*(long *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 8) !=
                 *(long *)((long)iVar8.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 8)) ||
               (*(uint *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                ._M_cur + 0x10) !=
                *(uint *)((long)iVar8.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                ._M_cur + 0x10))) {
              bVar18 = *(uint *)((long)iVar8.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                       ._M_cur + 0x10) <=
                       *(uint *)((long)iVar7.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                       ._M_cur + 0x10);
              goto LAB_0073aa84;
            }
          }
          bVar18 = uVar11 < uVar1;
        }
        else {
          bVar18 = iVar7.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                   _M_cur == (__node_type *)0x0;
        }
LAB_0073aa84:
        if (bVar18) {
          lVar17 = lVar16 * 2 + 1;
        }
        else {
          lVar17 = lVar16 * 2 + 2;
        }
        puVar2[lVar16] = puVar2[lVar17];
        lVar16 = lVar17;
      } while (lVar17 < (lVar13 - (lVar13 + -1 >> 0x3f)) + -1 >> 1);
    }
    if (((uVar12 & 4) == 0) && (lVar17 == lVar13 + -2 >> 1)) {
      puVar2[lVar17] = puVar2[lVar17 * 2 + 1];
      lVar17 = lVar17 * 2 + 1;
    }
    if (0 < lVar17) {
      do {
        lVar13 = (lVar17 - (lVar17 + -1 >> 0x3f)) + -1 >> 1;
        pGVar3 = (this_00->cmp).this;
        ppVar4 = (((this_00->cmp).privateSupertypes)->
                 super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar1 = puVar2[lVar13];
        local_68.id = ppVar4[uVar10].first.id;
        typeA.id = ppVar4[uVar1].first.id;
        iVar7 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pGVar3->wasm->typeIndices)._M_h,&local_68);
        iVar8 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pGVar3->wasm->typeIndices)._M_h,&typeA);
        if ((iVar7.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
             _M_cur != (__node_type *)0x0) ==
            (iVar8.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
             _M_cur != (__node_type *)0x0)) {
          if (iVar7.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
              _M_cur != (__node_type *)0x0) {
            if ((*(long *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 8) !=
                 *(long *)((long)iVar8.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 8)) ||
               (*(uint *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                ._M_cur + 0x10) !=
                *(uint *)((long)iVar8.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                ._M_cur + 0x10))) {
              if (*(uint *)((long)iVar8.
                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                  ._M_cur + 0x10) <=
                  *(uint *)((long)iVar7.
                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                  ._M_cur + 0x10)) goto LAB_0073abab;
              break;
            }
          }
          if (uVar10 <= uVar1) break;
        }
        else if (iVar7.
                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                 _M_cur != (__node_type *)0x0) break;
LAB_0073abab:
        puVar2[lVar17] = puVar2[lVar13];
        bVar18 = 2 < lVar17;
        lVar17 = lVar13;
      } while (bVar18);
    }
    puVar2[lVar17] = uVar10;
    puVar9 = (this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar14 = (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar10 = this->start;
  }
  uVar1 = puVar14[-1];
  (this_00->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar14 + -1;
  puVar9[uVar10] = uVar1;
  uVar10 = this->start;
  pvVar5 = (this_00->graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar15 = *(uint **)&pvVar5[puVar9[uVar10]].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar6 = *(pointer *)
            ((long)&pvVar5[puVar9[uVar10]].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8);
  while( true ) {
    if (puVar15 == puVar6) {
      return uVar10 + 1;
    }
    uVar1 = *puVar15;
    puVar9 = (this_00->indegrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = puVar9[uVar1];
    if (uVar11 == 0) break;
    uVar11 = uVar11 - 1;
    puVar9[uVar1] = uVar11;
    if (uVar11 == 0) {
      pushChoice(this_00,uVar1);
    }
    puVar15 = puVar15 + 1;
  }
  __assert_fail("ctx.indegrees[child] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                ,0xea,
                "Selector wasm::TopologicalOrdersImpl<(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)]"
               );
}

Assistant:

Selector select(TopologicalOrdersImpl& ctx) {
      assert(count >= 1);
      assert(start + count <= ctx.buf.size());
      if constexpr (TopologicalOrdersImpl::useMinHeap) {
        ctx.buf[start] = ctx.popChoice();
      }
      auto selection = ctx.buf[start];
      // The next selector will select the next index and will not be able to
      // choose the vertex we just selected.
      Selector next = {start + 1, count - 1, 0};
      // Append any child that this selection makes available to the choices for
      // the next selector.
      for (auto child : ctx.graph[selection]) {
        assert(ctx.indegrees[child] > 0);
        if (--ctx.indegrees[child] == 0) {
          if constexpr (TopologicalOrdersImpl::useMinHeap) {
            ctx.pushChoice(child);
          } else {
            ctx.buf[next.start + next.count] = child;
          }
          ++next.count;
        }
      }
      return next;
    }